

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.h
# Opt level: O2

iterator_filter<ezy::detail::iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:709:24)_&>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:710:22)_&>
* __thiscall
ezy::detail::
iterator_filter<ezy::detail::iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/tests/iterable_feature.cc:709:24)_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/tests/iterable_feature.cc:710:22)_&>
::operator++(iterator_filter<ezy::detail::iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:709:24)_&>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:710:22)_&>
             *this)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)(this->orig).
                   super_basic_iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                   .orig._M_current;
  do {
    pbVar1 = pbVar1 + 4;
    if (pbVar1 == (byte *)(this->end_iterator).
                          super_basic_iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                          .orig._M_current) break;
  } while ((*pbVar1 & 1) != 0);
  (this->orig).
  super_basic_iterator_adaptor<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  .orig._M_current = (int *)pbVar1;
  return this;
}

Assistant:

inline iterator_filter& operator++()
      {
        ++orig;
        for (; orig != end_iterator; ++orig)
          if (predicate(*orig))
            return *this;

        return *this;
      }